

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O2

void destroy_message_sender(AMQP_MESSENGER_INSTANCE_conflict *instance)

{
  if (instance->message_sender != (MESSAGE_SENDER_HANDLE)0x0) {
    messagesender_destroy(instance->message_sender);
    instance->message_sender = (MESSAGE_SENDER_HANDLE)0x0;
  }
  instance->message_sender_current_state = MESSAGE_SENDER_STATE_IDLE;
  instance->message_sender_previous_state = MESSAGE_SENDER_STATE_IDLE;
  instance->last_message_sender_state_change_time = -1;
  if (instance->sender_link != (LINK_HANDLE)0x0) {
    link_destroy(instance->sender_link);
    instance->sender_link = (LINK_HANDLE)0x0;
  }
  return;
}

Assistant:

static void destroy_message_sender(AMQP_MESSENGER_INSTANCE* instance)
{
    if (instance->message_sender != NULL)
    {
        messagesender_destroy(instance->message_sender);
        instance->message_sender = NULL;
    }

    instance->message_sender_current_state = MESSAGE_SENDER_STATE_IDLE;
    instance->message_sender_previous_state = MESSAGE_SENDER_STATE_IDLE;
    instance->last_message_sender_state_change_time = INDEFINITE_TIME;

    if (instance->sender_link != NULL)
    {
        link_destroy(instance->sender_link);
        instance->sender_link = NULL;
    }
}